

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_5::RepeatedVarint_Int64_Test::~RepeatedVarint_Int64_Test
          (RepeatedVarint_Int64_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedVarint, Int64) {
  RepeatedField<int64_t> v;

  // Insert -2^n, 2^n and 2^n-1.
  for (int n = 0; n < 10; n++) {
    v.Add(-(1 << n));
    v.Add(1 << n);
    v.Add((1 << n) - 1);
  }

  // Check consistency with the scalar Int64Size.
  size_t expected = 0;
  for (int i = 0; i < v.size(); i++) {
    expected += WireFormatLite::Int64Size(v[i]);
  }

  EXPECT_EQ(expected, WireFormatLite::Int64Size(v));
}